

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::setMessage(MidiMessage *this,vector<int,_std::allocator<int>_> *message)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  undefined4 local_1c;
  int i;
  vector<int,_std::allocator<int>_> *message_local;
  MidiMessage *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(message);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,sVar2);
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    if ((int)sVar2 <= local_1c) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](message,(long)local_1c);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)local_1c);
    *pvVar4 = (value_type)vVar1;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void MidiMessage::setMessage(const std::vector<int>& message) {
	resize(message.size());
	for (int i=0; i<(int)size(); i++) {
		(*this)[i] = (uchar)message[i];
	}
}